

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O2

void ewmh_update_desktop_viewport(natwm_state *state,monitor_list *list)

{
  int iVar1;
  ulong uVar2;
  monitor *monitor;
  xcb_ewmh_connection_t *pxVar3;
  long lVar4;
  xcb_rectangle_t xVar5;
  ulong uVar6;
  list *plVar7;
  int *piVar8;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uStack_40 = 0x107b33;
  plVar7 = list->monitors;
  uVar2 = plVar7->size;
  uVar6 = uVar2 * 8 + 0xf & 0xfffffffffffffff0;
  lVar4 = -uVar6;
  piVar8 = (int *)((long)&uStack_40 + (4 - uVar6));
  while (plVar7 = (list *)plVar7->head, plVar7 != (list *)0x0) {
    monitor = (monitor *)plVar7->size;
    *(undefined8 *)((long)&uStack_48 + lVar4) = 0x107b72;
    xVar5 = monitor_get_offset_rect(monitor);
    piVar8[-1] = (int)xVar5.x;
    *piVar8 = xVar5._0_4_ >> 0x10;
    piVar8 = piVar8 + 2;
  }
  pxVar3 = state->ewmh;
  iVar1 = state->screen_num;
  *(undefined8 *)((long)&uStack_48 + lVar4) = 0x107b97;
  xcb_ewmh_set_desktop_viewport(pxVar3,iVar1,uVar2 & 0xffffffff,(long)&uStack_40 + lVar4);
  return;
}

Assistant:

void ewmh_update_desktop_viewport(const struct natwm_state *state, const struct monitor_list *list)
{
        size_t num_monitors = list->monitors->size;
        xcb_ewmh_coordinates_t viewports[num_monitors];
        size_t index = 0;

        LIST_FOR_EACH(list->monitors, monitor_item)
        {
                struct monitor *monitor = (struct monitor *)monitor_item->data;
                xcb_rectangle_t rect = monitor_get_offset_rect(monitor);

                viewports[index].x = (uint32_t)rect.x;
                viewports[index].y = (uint32_t)rect.y;

                ++index;
        }

        xcb_ewmh_set_desktop_viewport(
                state->ewmh, state->screen_num, (uint32_t)num_monitors, viewports);
}